

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

double __thiscall NJamSpell::TLangModel::GetGram2Prob(TLangModel *this,TWordId word1,TWordId word2)

{
  double dVar1;
  TCount TVar2;
  pair<unsigned_int,_unsigned_int> key;
  double dVar3;
  
  dVar1 = 0.0;
  if (this->UnknownWordId != word1) {
    TVar2 = GetGramHashCount<unsigned_int>(word1,&this->PerfectHash,&this->Buckets);
    dVar1 = (double)TVar2;
  }
  dVar3 = 0.0;
  if (this->UnknownWordId != word2 && this->UnknownWordId != word1) {
    key.second = word2;
    key.first = word1;
    TVar2 = GetGramHashCount<std::pair<unsigned_int,unsigned_int>>
                      (key,&this->PerfectHash,&this->Buckets);
    dVar3 = (double)TVar2;
  }
  return ((double)(~-(ulong)(dVar1 < dVar3) & (ulong)dVar3) + this->K) /
         ((double)this->TotalWords + dVar1);
}

Assistant:

double TLangModel::GetGram2Prob(TWordId word1, TWordId word2) const {
    double countsGram1 = GetGram1HashCount(word1);
    double countsGram2 = GetGram2HashCount(word1, word2);
    if (countsGram2 > countsGram1) { // (hash collision)
        countsGram2 = 0;
    }
    countsGram1 += TotalWords;
    countsGram2 += K;
    return countsGram2 / countsGram1;
}